

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::InverseCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  stack_array<double,_16> *psVar1;
  int iVar2;
  transform_info *ptVar3;
  char *__function;
  grid *pgVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [64];
  grid_iterator<signed_char> ItEnd;
  grid_iterator<signed_char> It;
  grid_iterator<double> local_a0;
  grid_iterator<double> local_68;
  
  psVar1 = &(TransformDetails->BasisNorms).WaveNorms;
  lVar5 = 0;
  auVar12 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  do {
    if (Subbands->Size <= lVar5) {
      uVar6 = (ulong)(uint)TransformDetails->StackSize;
      pgVar4 = (TransformDetails->StackGrids).Arr + (uVar6 - 1);
      while( true ) {
        if ((int)uVar6 < 1) {
          return;
        }
        if (0x20 < uVar6) break;
        if (Vol->Type < __Invalid__) {
          iVar2 = (TransformDetails->StackAxes).Arr[uVar6 - 1];
          if (iVar2 == 2) {
            ILiftCdf53Z<double>(pgVar4,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            ILiftCdf53Y<double>(pgVar4,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            ILiftCdf53X<double>(pgVar4,M3,Normal,Vol);
          }
        }
        pgVar4 = pgVar4 + -1;
        uVar6 = uVar6 - 1;
      }
      __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
LAB_0016ec73:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,__function);
    }
    if (lVar5 != 0 || CoarsestLevel) {
      dVar8 = auVar12._0_8_;
      pgVar4 = (grid *)((Subbands->Buffer).Data + lVar5 * 0x40);
      dVar7 = dVar8;
      if ((M3->field_0).field_0.X != 1) {
        iVar2 = (int)*(char *)((long)&pgVar4[2].super_extent.From + 3) +
                TransformDetails->NPasses * Iter;
        if (*(char *)((long)&pgVar4[2].super_extent.From + 6) == '\0') {
          if (iVar2 < 0x11) {
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
            goto LAB_0016e7a4;
          }
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (iVar2 < 0x10) {
LAB_0016e7a4:
            dVar7 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
            goto LAB_0016e7ab;
          }
        }
        goto LAB_0016ec5e;
      }
LAB_0016e7ab:
      dVar10 = dVar8;
      if ((M3->field_0).field_0.Y != 1) {
        iVar2 = (int)*(char *)((long)&pgVar4[2].super_extent.From + 4) +
                TransformDetails->NPasses * Iter;
        if (*(char *)((long)&pgVar4[2].super_extent.From + 7) == '\0') {
          if (iVar2 < 0x11) {
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
            goto LAB_0016e7f1;
          }
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (iVar2 < 0x10) {
LAB_0016e7f1:
            dVar10 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
            goto LAB_0016e7f8;
          }
        }
        goto LAB_0016ec5e;
      }
LAB_0016e7f8:
      dVar11 = dVar8;
      if ((M3->field_0).field_0.Z != 1) {
        iVar2 = (int)*(char *)((long)&pgVar4[2].super_extent.From + 5) +
                TransformDetails->NPasses * Iter;
        if ((char)pgVar4[2].super_extent.Dims == '\0') {
          if (iVar2 < 0x11) {
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
            goto LAB_0016e83e;
          }
        }
        else {
          ptVar3 = (transform_info *)psVar1;
          if (iVar2 < 0x10) {
LAB_0016e83e:
            dVar11 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
            goto LAB_0016e845;
          }
        }
LAB_0016ec5e:
        __function = "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
        goto LAB_0016ec73;
      }
LAB_0016e845:
      if (Vol->Type < __Invalid__) {
        dVar8 = dVar8 / (dVar7 * dVar10 * dVar11);
        switch(Vol->Type) {
        case int8:
          End<signed_char>((grid_iterator<signed_char> *)&local_a0,pgVar4,Vol);
          Begin<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(char *)local_68.Ptr = (char)(int)((double)(int)*(char *)local_68.Ptr * dVar8);
            grid_iterator<signed_char>::operator++((grid_iterator<signed_char> *)&local_68);
          }
          break;
        case uint8:
          End<unsigned_char>((grid_iterator<unsigned_char> *)&local_a0,pgVar4,Vol);
          Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(char *)local_68.Ptr = (char)(int)((double)*(byte *)local_68.Ptr * dVar8);
            grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&local_68);
          }
          break;
        case int16:
          End<short>((grid_iterator<short> *)&local_a0,pgVar4,Vol);
          Begin<short>((grid_iterator<short> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(short *)local_68.Ptr = (short)(int)((double)(int)*(short *)local_68.Ptr * dVar8);
            grid_iterator<short>::operator++((grid_iterator<short> *)&local_68);
          }
          break;
        case uint16:
          End<unsigned_short>((grid_iterator<unsigned_short> *)&local_a0,pgVar4,Vol);
          Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(short *)local_68.Ptr = (short)(int)((double)*(ushort *)local_68.Ptr * dVar8);
            grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&local_68);
          }
          break;
        case int32:
          End<int>((grid_iterator<int> *)&local_a0,pgVar4,Vol);
          Begin<int>((grid_iterator<int> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(int *)local_68.Ptr = (int)((double)(int)*(float *)local_68.Ptr * dVar8);
            grid_iterator<int>::operator++((grid_iterator<int> *)&local_68);
          }
          break;
        case uint32:
          End<unsigned_int>((grid_iterator<unsigned_int> *)&local_a0,pgVar4,Vol);
          Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(float *)local_68.Ptr = (float)(long)((double)(uint)*(float *)local_68.Ptr * dVar8);
            grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&local_68);
          }
          break;
        case int64:
          End<long>((grid_iterator<long> *)&local_a0,pgVar4,Vol);
          Begin<long>((grid_iterator<long> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *local_68.Ptr = (double)(long)((double)(long)*local_68.Ptr * dVar8);
            grid_iterator<long>::operator++((grid_iterator<long> *)&local_68);
          }
          break;
        case uint64:
          End<unsigned_long>((grid_iterator<unsigned_long> *)&local_a0,pgVar4,Vol);
          Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *local_68.Ptr;
            auVar9 = vunpcklps_avx(auVar9,_DAT_00187bc0);
            auVar9 = vsubpd_avx(auVar9,_DAT_00187bd0);
            dVar7 = (auVar9._0_8_ + auVar9._8_8_) * dVar8;
            uVar6 = (ulong)dVar7;
            *local_68.Ptr =
                 (double)((long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
            grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&local_68);
          }
          break;
        case float32:
          End<float>((grid_iterator<float> *)&local_a0,pgVar4,Vol);
          Begin<float>((grid_iterator<float> *)&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *(float *)local_68.Ptr = (float)((double)*(float *)local_68.Ptr * dVar8);
            grid_iterator<float>::operator++((grid_iterator<float> *)&local_68);
          }
          break;
        case float64:
          End<double>(&local_a0,pgVar4,Vol);
          Begin<double>(&local_68,pgVar4,Vol);
          while (local_68.Ptr != local_a0.Ptr) {
            *local_68.Ptr = dVar8 * *local_68.Ptr;
            grid_iterator<double>::operator++(&local_68);
          }
        }
        auVar12 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void
InverseCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  /* inverse normalize if required */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* perform the inverse transform */
  int I = TransformDetails.StackSize;
  while (I-- > 0)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}